

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

int SUNMatScaleAdd_Dense(realtype c,SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  sunindextype j;
  sunindextype i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  undefined4 local_4;
  
  iVar1 = SMCompatible_Dense((SUNMatrix)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (SUNMatrix)0xed3f63);
  if (iVar1 == 0) {
    local_4 = -0x2bd;
  }
  else {
    for (iVar1 = 0; iVar1 < *(int *)(*in_RDI + 4); iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 < *(int *)*in_RDI; iVar2 = iVar2 + 1) {
        *(double *)(*(long *)(*(long *)(*in_RDI + 0x18) + (long)iVar1 * 8) + (long)iVar2 * 8) =
             in_XMM0_Qa *
             *(double *)(*(long *)(*(long *)(*in_RDI + 0x18) + (long)iVar1 * 8) + (long)iVar2 * 8) +
             *(double *)(*(long *)(*(long *)(*in_RSI + 0x18) + (long)iVar1 * 8) + (long)iVar2 * 8);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNMatScaleAdd_Dense(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Dense(A, B))
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  for (j=0; j<SM_COLUMNS_D(A); j++)
    for (i=0; i<SM_ROWS_D(A); i++)
      SM_ELEMENT_D(A,i,j) = c*SM_ELEMENT_D(A,i,j) + SM_ELEMENT_D(B,i,j);
  return SUNMAT_SUCCESS;
}